

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_disconnect(LIBSSH2_SESSION *session,int reason,char *description,char *lang)

{
  int iVar1;
  size_t sStack_48;
  int rc;
  size_t lang_len;
  size_t descr_len;
  uchar *s;
  char *lang_local;
  char *description_local;
  LIBSSH2_SESSION *pLStack_18;
  int reason_local;
  LIBSSH2_SESSION *session_local;
  
  lang_len = 0;
  sStack_48 = 0;
  s = (uchar *)lang;
  lang_local = description;
  description_local._4_4_ = reason;
  pLStack_18 = session;
  if (session->disconnect_state == libssh2_NB_state_idle) {
    if (description != (char *)0x0) {
      lang_len = strlen(description);
    }
    if (s != (uchar *)0x0) {
      sStack_48 = strlen((char *)s);
    }
    if (0x100 < lang_len) {
      iVar1 = _libssh2_error(pLStack_18,-0x22,"too long description");
      return iVar1;
    }
    if (0x100 < sStack_48) {
      iVar1 = _libssh2_error(pLStack_18,-0x22,"too long language string");
      return iVar1;
    }
    pLStack_18->disconnect_data_len = lang_len + sStack_48 + 0xd;
    descr_len = (size_t)(pLStack_18->disconnect_data + 1);
    pLStack_18->disconnect_data[0] = '\x01';
    _libssh2_store_u32((uchar **)&descr_len,description_local._4_4_);
    _libssh2_store_str((uchar **)&descr_len,lang_local,lang_len);
    _libssh2_store_u32((uchar **)&descr_len,(uint32_t)sStack_48);
    pLStack_18->disconnect_state = libssh2_NB_state_created;
  }
  iVar1 = _libssh2_transport_send
                    (pLStack_18,pLStack_18->disconnect_data,pLStack_18->disconnect_data_len,s,
                     sStack_48);
  if (iVar1 == -0x25) {
    session_local._4_4_ = -0x25;
  }
  else {
    pLStack_18->disconnect_state = libssh2_NB_state_idle;
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

static int
session_disconnect(LIBSSH2_SESSION *session, int reason,
                   const char *description,
                   const char *lang)
{
    unsigned char *s;
    size_t descr_len = 0, lang_len = 0;
    int rc;

    if(session->disconnect_state == libssh2_NB_state_idle) {
        _libssh2_debug((session, LIBSSH2_TRACE_TRANS,
                       "Disconnecting: reason=%d, desc=%s, lang=%s", reason,
                       description, lang));
        if(description)
            descr_len = strlen(description);

        if(lang)
            lang_len = strlen(lang);

        if(descr_len > 256)
            return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                                  "too long description");

        if(lang_len > 256)
            return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                                  "too long language string");

        /* 13 = packet_type(1) + reason code(4) + descr_len(4) + lang_len(4) */
        session->disconnect_data_len = descr_len + lang_len + 13;

        s = session->disconnect_data;

        *(s++) = SSH_MSG_DISCONNECT;
        _libssh2_store_u32(&s, reason);
        _libssh2_store_str(&s, description, descr_len);
        /* store length only, lang is sent separately */
        _libssh2_store_u32(&s, (uint32_t)lang_len);

        session->disconnect_state = libssh2_NB_state_created;
    }

    rc = _libssh2_transport_send(session, session->disconnect_data,
                                 session->disconnect_data_len,
                                 (const unsigned char *)lang, lang_len);
    if(rc == LIBSSH2_ERROR_EAGAIN)
        return rc;

    session->disconnect_state = libssh2_NB_state_idle;

    return 0;
}